

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEnable.c
# Opt level: O3

void Gia_ManPrintSignals(Gia_Man_t *p,int *pFreq,char *pStr)

{
  bool bVar1;
  Vec_Int_t *p_00;
  int *__ptr;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  __ptr = (int *)malloc(400);
  p_00->pArray = __ptr;
  if ((long)p->nObjs < 1) {
    uVar2 = 0;
    uVar6 = 0;
  }
  else {
    lVar4 = 0;
    uVar6 = 0;
    uVar2 = 0;
    do {
      iVar5 = pFreq[lVar4];
      bVar1 = 1 < iVar5;
      if (iVar5 < 2) {
        iVar5 = 0;
      }
      uVar2 = (ulong)((int)uVar2 + (uint)bVar1);
      uVar6 = (ulong)(uint)((int)uVar6 + iVar5);
      lVar4 = lVar4 + 1;
    } while (p->nObjs != lVar4);
  }
  printf("%s (total = %d  driven = %d)\n",pStr,uVar2,uVar6);
  iVar5 = p->nObjs;
  if (0 < iVar5) {
    uVar6 = 0;
    uVar3 = 0;
    do {
      if (10 < pFreq[uVar6]) {
        uVar3 = uVar3 + 1;
        printf("%3d :   Obj = %6d   Refs = %6d   Freq = %6d\n",(ulong)uVar3,uVar6 & 0xffffffff,
               (ulong)(uint)p->pRefs[uVar6]);
        Vec_IntPush(p_00,(int)uVar6);
        iVar5 = p->nObjs;
      }
      uVar6 = uVar6 + 1;
    } while ((long)uVar6 < (long)iVar5);
    __ptr = p_00->pArray;
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  free(p_00);
  return;
}

Assistant:

void Gia_ManPrintSignals( Gia_Man_t * p, int * pFreq, char * pStr )
{
    Vec_Int_t * vObjs;
    int i, Counter = 0, nTotal = 0;
    vObjs = Vec_IntAlloc( 100 );
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        if ( pFreq[i] > 1 )
        {
            nTotal += pFreq[i];
            Counter++;
        }
    printf( "%s (total = %d  driven = %d)\n", pStr, Counter, nTotal );
    Counter = 0;
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        if ( pFreq[i] > 10 )
        {
            printf( "%3d :   Obj = %6d   Refs = %6d   Freq = %6d\n", 
                ++Counter, i, Gia_ObjRefNum(p, Gia_ManObj(p,i)), pFreq[i] );
            Vec_IntPush( vObjs, i );
        }
    Vec_IntFree( vObjs );
}